

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base_matrix_with_column_compression.h
# Opt level: O1

void Gudhi::persistence_matrix::swap
               (Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>
                *matrix1,
               Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>
               *matrix2)

{
  Index IVar1;
  pointer ppCVar2;
  Column_settings *pCVar3;
  Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>
  *pSVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  
  boost::intrusive::bstree_algorithms<boost::intrusive::rbtree_node_traits<void_*,_false>_>::
  swap_tree((node_ptr)matrix1,(node_ptr)matrix2);
  std::
  swap<boost::disjoint_sets_with_storage<boost::typed_identity_property_map<unsigned_long>,boost::typed_identity_property_map<unsigned_long>,boost::find_with_full_path_compression>>
            (&matrix1->columnClasses_,&matrix2->columnClasses_);
  ppCVar5 = (matrix1->repToColumn_).
            super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppCVar6 = (matrix1->repToColumn_).
            super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppCVar2 = (matrix1->repToColumn_).
            super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (matrix1->repToColumn_).
  super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (matrix2->repToColumn_).
       super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (matrix1->repToColumn_).
  super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (matrix2->repToColumn_).
       super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (matrix1->repToColumn_).
  super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (matrix2->repToColumn_).
       super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (matrix2->repToColumn_).
  super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
  ._M_impl.super__Vector_impl_data._M_start = ppCVar5;
  (matrix2->repToColumn_).
  super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppCVar6;
  (matrix2->repToColumn_).
  super__Vector_base<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*,_std::allocator<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar2;
  IVar1 = matrix1->nextColumnIndex_;
  matrix1->nextColumnIndex_ = matrix2->nextColumnIndex_;
  matrix2->nextColumnIndex_ = IVar1;
  pCVar3 = matrix1->colSettings_;
  matrix1->colSettings_ = matrix2->colSettings_;
  matrix2->colSettings_ = pCVar3;
  pSVar4 = (matrix1->columnPool_)._M_t.
           super___uniq_ptr_impl<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>,_std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_*,_std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_>_>
           .
           super__Head_base<0UL,_Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_*,_false>
           ._M_head_impl;
  (matrix1->columnPool_)._M_t.
  super___uniq_ptr_impl<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>,_std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_*,_std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_>_>
  .
  super__Head_base<0UL,_Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_*,_false>
  ._M_head_impl =
       (matrix2->columnPool_)._M_t.
       super___uniq_ptr_impl<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>,_std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_*,_std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_>_>
       .
       super__Head_base<0UL,_Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_*,_false>
       ._M_head_impl;
  (matrix2->columnPool_)._M_t.
  super___uniq_ptr_impl<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>,_std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_*,_std::default_delete<Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_>_>
  .
  super__Head_base<0UL,_Gudhi::Simple_object_pool<Gudhi::persistence_matrix::Base_matrix_with_column_compression<Gudhi::persistence_matrix::Matrix<Column_compression_options<true,_(Gudhi::persistence_matrix::Column_types)7>_>_>::Column>_*,_false>
  ._M_head_impl = pSVar4;
  return;
}

Assistant:

void swap(Base_matrix_with_column_compression& matrix1, Base_matrix_with_column_compression& matrix2) {
    matrix1.columnToRep_.swap(matrix2.columnToRep_);
    std::swap(matrix1.columnClasses_, matrix2.columnClasses_);
    matrix1.repToColumn_.swap(matrix2.repToColumn_);
    std::swap(matrix1.nextColumnIndex_, matrix2.nextColumnIndex_);
    std::swap(matrix1.colSettings_, matrix2.colSettings_);
    std::swap(matrix1.columnPool_, matrix2.columnPool_);

    if constexpr (Master_matrix::Option_list::has_row_access) {
      swap(static_cast<typename Master_matrix::Matrix_row_access_option&>(matrix1),
           static_cast<typename Master_matrix::Matrix_row_access_option&>(matrix2));
    }
  }